

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O2

size_t private_ACUtils_ADynArray_growStrategyGeneric
                 (size_t requiredSize,size_t minCapacity,size_t maxCapacity,double multiplier,
                 size_t maxDifSize)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  
  if (minCapacity < requiredSize) {
    auVar5._8_4_ = (int)(requiredSize >> 0x20);
    auVar5._0_8_ = requiredSize;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)(minCapacity >> 0x20);
    auVar6._0_8_ = minCapacity;
    auVar6._12_4_ = 0x45300000;
    dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)minCapacity) - 4503599627370496.0);
    dVar3 = log(((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)requiredSize) - 4503599627370496.0)) / dVar7);
    dVar4 = log(multiplier);
    dVar3 = ceil(dVar3 / dVar4);
    dVar3 = pow(multiplier,dVar3);
    dVar3 = dVar3 * dVar7;
    uVar1 = (ulong)dVar3;
    uVar1 = (long)(dVar3 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
    uVar2 = requiredSize + maxDifSize;
    if (uVar1 - requiredSize <= maxDifSize) {
      uVar2 = uVar1;
    }
    if (maxCapacity <= uVar2) {
      uVar2 = maxCapacity;
    }
    return uVar2;
  }
  return minCapacity;
}

Assistant:

ACUTILS_HD_FUNC size_t private_ACUtils_ADynArray_growStrategyGeneric(size_t requiredSize, size_t minCapacity, size_t maxCapacity, double multiplier, size_t maxDifSize) {
    double multiplierExponent;
    size_t capacity;
    if(requiredSize <= minCapacity)
        return minCapacity;
    multiplierExponent = ceil(log((double) requiredSize / minCapacity) / log(multiplier));
    capacity = (size_t) (minCapacity * pow(multiplier, multiplierExponent));
    if(capacity - requiredSize > maxDifSize)
        capacity = requiredSize + maxDifSize;
    if(capacity > maxCapacity)
        capacity = maxCapacity;
    return capacity;
}